

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Allocator *pAVar2;
  ulong uVar3;
  bool bVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  Mat *pMVar11;
  void *__src;
  long lVar12;
  int *piVar13;
  Option *pOVar14;
  void *pvVar15;
  int iVar16;
  undefined1 *__src_00;
  uint uVar17;
  int h;
  int _woffset;
  int _hoffset;
  int _outw;
  Mat *local_160;
  Mat m;
  int _outh;
  size_t local_108;
  Option *local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 *local_e8;
  Mat m_1;
  int _outc;
  int _outd;
  int _coffset;
  int _doffset;
  Mat m_2;
  
  iVar16 = bottom_blob->w;
  iVar10 = bottom_blob->h;
  m.d = bottom_blob->d;
  local_108 = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  uVar17 = bottom_blob->dims - 1;
  uVar9 = (ulong)uVar17;
  local_f0 = CONCAT44(local_f0._4_4_,bottom_blob->c);
  local_f8 = (undefined1 *)CONCAT44(local_f8._4_4_,m.d);
  if (3 < uVar17) {
    m.cstep = 0;
    m.elemsize._0_4_ = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    goto LAB_0025a317;
  }
  lVar8 = (long)iVar16;
  lVar12 = (long)iVar10;
  m.w = iVar16;
  switch(uVar9) {
  case 0:
    m.cstep = bottom_blob->elempack * lVar8;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 1;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    break;
  case 1:
    lVar12 = bottom_blob->elempack * lVar12;
    m.elemsize._0_4_ = 4;
    m.elempack = 1;
    m.dims = 2;
    m.h = (int)lVar12;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar12 * lVar8;
    break;
  case 2:
    iVar1 = bottom_blob->elempack;
    m.dims = 3;
    m.d = 1;
    lVar12 = lVar12 * lVar8;
    goto LAB_0025a28b;
  case 3:
    iVar1 = bottom_blob->elempack;
    m.dims = 4;
    lVar12 = lVar12 * lVar8 * (long)m.d;
LAB_0025a28b:
    m.c = iVar1 * bottom_blob->c;
    m.elempack = 1;
    m.elemsize._0_4_ = 4;
    m.cstep = lVar12 + 3U & 0x3ffffffffffffffc;
    m.h = iVar10;
  }
LAB_0025a317:
  m.elemsize._4_4_ = 0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.allocator = (Allocator *)0x0;
  m.data = (void *)0x0;
  piVar13 = &_doffset;
  local_160 = top_blob;
  local_100 = opt;
  resolve_crop_roi(this,&m,&_woffset,&_hoffset,piVar13,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pMVar11 = local_160;
  if (3 < uVar17) {
    return 0;
  }
  switch(uVar9) {
  case 0:
    if (_outw != iVar16) {
      Mat::create(local_160,_outw,local_108,local_100->blob_allocator);
      if (pMVar11->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar11->c * pMVar11->cstep == 0) {
        return -100;
      }
      if (local_108 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar11,0,_woffset);
        return 0;
      }
      if (local_108 == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar11,0,_woffset);
        return 0;
      }
      if (local_108 == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar11,0,_woffset);
        return 0;
      }
      return 0;
    }
    if (local_160 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_160->refcount;
    if (piVar13 == (int *)0x0) goto LAB_0025ae72;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_0025ae72;
    pvVar15 = local_160->data;
    pAVar2 = local_160->allocator;
    break;
  case 1:
    if (iVar10 != _outh || iVar16 != _outw) {
      Mat::create(local_160,_outw,_outh,local_108,local_100->blob_allocator);
      if (pMVar11->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar11->c * pMVar11->cstep == 0) {
        return -100;
      }
      if (local_108 == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar11,_hoffset,_woffset);
        return 0;
      }
      if (local_108 != 2) {
        if (local_108 != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar11,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar11,_hoffset,_woffset);
      return 0;
    }
    if (local_160 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_160->refcount;
    if (piVar13 == (int *)0x0) goto LAB_0025ae72;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_0025ae72;
    pvVar15 = local_160->data;
    pAVar2 = local_160->allocator;
    break;
  case 2:
    if (_outc != (int)local_f0 || (iVar10 != _outh || iVar16 != _outw)) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      uVar9 = bottom_blob->elemsize;
      m.data = (void *)((long)_coffset * bottom_blob->cstep * uVar9 + (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar9;
      m.elemsize._4_4_ = (undefined4)(uVar9 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar9 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar9;
      m.dims = bottom_blob->dims;
      if (iVar10 != _outh || iVar16 != _outw) {
        Mat::create(local_160,_outw,_outh,_outc,local_108,local_100->blob_allocator);
        iVar16 = -100;
        if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
          if (0 < _outc) {
            local_f8 = (undefined1 *)(ulong)(uint)_outc;
            local_e8 = (undefined1 *)(long)_woffset;
            pOVar14 = (Option *)0x0;
            do {
              lVar8 = (long)m.w;
              m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.data = (void *)(m.cstep * (long)pOVar14 * m_1.elemsize + (long)m.data);
              m_1.refcount = (int *)0x0;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.w = m.w;
              m_1.h = m.h;
              m_1.c = m.d;
              m_1.d = 1;
              m_1.dims = m.dims + -1;
              m_1.cstep = (m_1.elemsize * m.h * lVar8 + 0xf & 0xfffffffffffffff0) / m_1.elemsize;
              if (m.dims == 4) {
                m_1.cstep = m.h * lVar8;
              }
              uVar17 = pMVar11->w;
              lVar12 = (long)(int)uVar17;
              iVar16 = pMVar11->h;
              m_2.elemsize = pMVar11->elemsize;
              pvVar15 = (void *)(pMVar11->cstep * (long)pOVar14 * m_2.elemsize + (long)pMVar11->data
                                );
              m_2.elempack = pMVar11->elempack;
              m_2.allocator = pMVar11->allocator;
              m_2.refcount = (int *)0x0;
              m_2.c = pMVar11->d;
              m_2.d = 1;
              m_2.dims = pMVar11->dims + -1;
              m_2.cstep = (m_2.elemsize * iVar16 * lVar12 + 0xf & 0xfffffffffffffff0) / m_2.elemsize
              ;
              if (pMVar11->dims == 4) {
                m_2.cstep = iVar16 * lVar12;
              }
              local_100 = pOVar14;
              m_2.data = pvVar15;
              m_2.w = uVar17;
              m_2.h = iVar16;
              if (local_108 == 4) {
                copy_cut_border_image<float>(&m_1,&m_2,_hoffset,(int)local_e8);
              }
              else if (local_108 == 2) {
                copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,(int)local_e8);
              }
              else if ((local_108 == 1) && (0 < iVar16)) {
                __src_00 = (undefined1 *)
                           ((long)m_1.data +
                           (long)(local_e8 + m_1.elemsize * lVar8 * (long)_hoffset));
                iVar10 = 0;
                local_f0 = lVar12;
                do {
                  if ((int)lVar12 < 0xc) {
                    if (0 < (int)uVar17) {
                      uVar9 = 0;
                      do {
                        *(undefined1 *)((long)pvVar15 + uVar9) = __src_00[uVar9];
                        uVar9 = uVar9 + 1;
                      } while (uVar17 != uVar9);
                    }
                  }
                  else {
                    memcpy(pvVar15,__src_00,(ulong)uVar17);
                    lVar12 = local_f0;
                  }
                  pvVar15 = (void *)((long)pvVar15 + lVar12);
                  __src_00 = __src_00 + lVar8;
                  iVar10 = iVar10 + 1;
                } while (iVar10 != iVar16);
              }
              pOVar14 = (Option *)&local_100->field_0x1;
              pMVar11 = local_160;
            } while (pOVar14 < local_f8);
          }
          goto LAB_0025af8d;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outh,(void *)(long)m.w);
        pMVar11 = local_160;
        if (&m_1 != local_160) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar13 = local_160->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (local_160->allocator == (Allocator *)0x0) {
                if (local_160->data != (void *)0x0) {
                  free(local_160->data);
                }
              }
              else {
                (*local_160->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar11->data = m_1.data;
          pMVar11->refcount = m_1.refcount;
          pMVar11->elemsize = m_1.elemsize;
          pMVar11->elempack = m_1.elempack;
          pMVar11->allocator = m_1.allocator;
          pMVar11->dims = m_1.dims;
          pMVar11->w = m_1.w;
          pMVar11->h = m_1.h;
          pMVar11->d = m_1.d;
          pMVar11->c = m_1.c;
          pMVar11->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0)) {
          iVar16 = -100;
        }
        else {
LAB_0025af8d:
          iVar16 = 0;
        }
      }
      piVar13 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar13 == (int *)0x0) {
        return iVar16;
      }
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 != 0) {
        return iVar16;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar16;
      }
joined_r0x0025b0c6:
      if (m.data != (void *)0x0) {
        m.allocator = (Allocator *)0x0;
        free(m.data);
        return iVar16;
      }
      return iVar16;
    }
    if (local_160 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_160->refcount;
    if (piVar13 == (int *)0x0) goto LAB_0025ae72;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_0025ae72;
    pvVar15 = local_160->data;
    pAVar2 = local_160->allocator;
    break;
  case 3:
    bVar4 = (int)local_f8 == _outd;
    bVar6 = iVar10 == _outh;
    bVar7 = iVar16 == _outw;
    if (_outc != (int)local_f0 || (!bVar4 || (!bVar6 || !bVar7))) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      uVar3 = bottom_blob->elemsize;
      m.data = (void *)((long)_coffset * bottom_blob->cstep * uVar3 + (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar3;
      m.elemsize._4_4_ = (undefined4)(uVar3 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)m.d * uVar3 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar3;
      m.dims = bottom_blob->dims;
      if (bVar4 && (bVar6 && bVar7)) {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,
                   (&switchD_0025a3af::switchdataD_00558404)[uVar9] + 0x558404,
                   (void *)CONCAT71((int7)((ulong)piVar13 >> 8),bVar4 && (bVar6 && bVar7)));
        pMVar11 = local_160;
        if (&m_1 != local_160) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar13 = local_160->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (local_160->allocator == (Allocator *)0x0) {
                if (local_160->data != (void *)0x0) {
                  free(local_160->data);
                }
              }
              else {
                (*local_160->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar11->data = m_1.data;
          pMVar11->refcount = m_1.refcount;
          pMVar11->elemsize = m_1.elemsize;
          pMVar11->elempack = m_1.elempack;
          pMVar11->allocator = m_1.allocator;
          pMVar11->dims = m_1.dims;
          pMVar11->w = m_1.w;
          pMVar11->h = m_1.h;
          pMVar11->d = m_1.d;
          pMVar11->c = m_1.c;
          pMVar11->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar11->data == (void *)0x0) || ((long)pMVar11->c * pMVar11->cstep == 0)) {
          iVar16 = -100;
        }
        else {
LAB_0025b087:
          iVar16 = 0;
        }
      }
      else {
        local_e8 = (undefined1 *)(ulong)(uint)_outd;
        Mat::create(local_160,_outw,_outh,_outd,_outc,local_108,local_100->blob_allocator);
        iVar16 = -100;
        if ((pMVar11->data != (void *)0x0) && ((long)pMVar11->c * pMVar11->cstep != 0)) {
          if (0 < _outc) {
            local_f8 = (undefined1 *)0x0;
            do {
              if (0 < (int)local_e8) {
                pOVar14 = (Option *)0x0;
                do {
                  local_f0 = (long)m.w;
                  m_1.elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                  m_1.cstep = m.h * local_f0;
                  m_1.data = (void *)((long)m.data +
                                     ((long)(int)pOVar14 + (long)_doffset) * m_1.elemsize *
                                     m_1.cstep + m.cstep * (long)local_f8 * m_1.elemsize);
                  m_1.refcount = (int *)0x0;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.dims = 2;
                  m_1.w = m.w;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = 1;
                  uVar17 = pMVar11->w;
                  m_2.elemsize = pMVar11->elemsize;
                  iVar16 = pMVar11->h;
                  m_2.elempack = pMVar11->elempack;
                  m_2.cstep = (long)iVar16 * (long)(int)uVar17;
                  pvVar15 = (void *)((long)pMVar11->data +
                                    (long)pOVar14 * m_2.elemsize * m_2.cstep +
                                    pMVar11->cstep * (long)local_f8 * m_2.elemsize);
                  m_2.allocator = pMVar11->allocator;
                  m_2.refcount = (int *)0x0;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  local_100 = pOVar14;
                  m_2.data = pvVar15;
                  m_2.w = uVar17;
                  m_2.h = iVar16;
                  if (local_108 == 4) {
                    copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if (local_108 == 2) {
                    copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if ((local_108 == 1) && (0 < iVar16)) {
                    __src = (void *)((long)m_1.data +
                                    _hoffset * local_f0 * m_1.elemsize + (long)_woffset);
                    iVar10 = 0;
                    do {
                      if ((int)uVar17 < 0xc) {
                        if (0 < (int)uVar17) {
                          uVar9 = 0;
                          do {
                            *(undefined1 *)((long)pvVar15 + uVar9) =
                                 *(undefined1 *)((long)__src + uVar9);
                            uVar9 = uVar9 + 1;
                          } while (uVar17 != uVar9);
                        }
                      }
                      else {
                        memcpy(pvVar15,__src,(ulong)uVar17);
                      }
                      pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar17);
                      __src = (void *)((long)__src + local_f0);
                      iVar10 = iVar10 + 1;
                    } while (iVar10 != iVar16);
                  }
                  pOVar14 = (Option *)&local_100->field_0x1;
                  pMVar11 = local_160;
                } while (pOVar14 < local_e8);
              }
              local_f8 = (undefined1 *)((long)local_f8 + 1);
            } while (local_f8 < (ulong)(uint)_outc);
          }
          goto LAB_0025b087;
        }
      }
      piVar13 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar13 == (int *)0x0) {
        return iVar16;
      }
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 != 0) {
        return iVar16;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar16;
      }
      goto joined_r0x0025b0c6;
    }
    if (local_160 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_160->refcount;
    if (piVar13 == (int *)0x0) goto LAB_0025ae72;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_0025ae72;
    pvVar15 = local_160->data;
    pAVar2 = local_160->allocator;
  }
  if (pAVar2 == (Allocator *)0x0) {
    if (pvVar15 != (void *)0x0) {
      free(pvVar15);
    }
  }
  else {
    (*pAVar2->_vptr_Allocator[3])();
  }
LAB_0025ae72:
  pMVar11->cstep = 0;
  pMVar11->data = (void *)0x0;
  pMVar11->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar11->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar11->elemsize + 4) = 0;
  pMVar11->dims = 0;
  pMVar11->w = 0;
  pMVar11->h = 0;
  pMVar11->d = 0;
  pMVar11->c = 0;
  piVar13 = bottom_blob->refcount;
  pMVar11->data = bottom_blob->data;
  pMVar11->refcount = piVar13;
  pMVar11->elemsize = bottom_blob->elemsize;
  pMVar11->elempack = bottom_blob->elempack;
  pMVar11->allocator = bottom_blob->allocator;
  iVar16 = bottom_blob->w;
  iVar10 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  pMVar11->dims = bottom_blob->dims;
  pMVar11->w = iVar16;
  pMVar11->h = iVar10;
  pMVar11->d = iVar1;
  pMVar11->c = bottom_blob->c;
  pMVar11->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}